

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# klibexec.h
# Opt level: O1

void KDict_DoEach(KonohaContext *kctx,KDict *dict,void *thunk,
                 _func_void_KonohaContext_ptr_void_ptr_KKeyValue_ptr *f)

{
  KKeyValue *pKVar1;
  long lVar2;
  ulong uVar3;
  
  uVar3 = (dict->data).bytesize;
  if (0xf < uVar3) {
    uVar3 = uVar3 >> 4;
    lVar2 = 0;
    do {
      pKVar1 = (dict->data).field_1.keyValueItems;
      if ((*(int *)((long)&pKVar1->typeAttr + lVar2) != 0) ||
         (*(long *)((long)&pKVar1->field_2 + lVar2) != 0)) {
        (*f)(kctx,thunk,(KKeyValue *)((long)&pKVar1->key + lVar2));
      }
      lVar2 = lVar2 + 0x10;
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  return;
}

Assistant:

KLIBDECL void KDict_DoEach(KonohaContext *kctx, KDict *dict, void *thunk, void (*f)(KonohaContext*, void *, KKeyValue *))
{
	size_t i, size = KDict_size(dict);
	for(i = 0; i < size; i++) {
		KKeyValue *kvs = dict->data.keyValueItems + i;
		if(kvs->typeAttr == 0 && kvs->unboxValue == 0) continue;
		f(kctx, thunk, kvs);
	}
}